

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void __thiscall fmt::v6::detail::bigint::subtract_aligned(bigint *this,bigint *other)

{
  size_t sVar1;
  uint *puVar2;
  uint *puVar3;
  int iVar4;
  uint uVar5;
  char *in_RAX;
  ulong uVar6;
  size_t sVar7;
  char *unaff_RBX;
  long lVar8;
  long lVar9;
  
  if (other->exp_ < this->exp_) {
    assert_fail(unaff_RBX,0,in_RAX);
  }
  iVar4 = compare(this,other);
  if (iVar4 < 0) {
    assert_fail(unaff_RBX,0,in_RAX);
  }
  sVar1 = (other->bigits_).super_buffer<unsigned_int>.size_;
  if (sVar1 != 0) {
    uVar5 = other->exp_ - this->exp_;
    if ((int)uVar5 < 0) {
LAB_0018ad14:
      assert_fail(unaff_RBX,0,in_RAX);
    }
    puVar2 = (other->bigits_).super_buffer<unsigned_int>.ptr_;
    puVar3 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    uVar6 = (ulong)uVar5;
    sVar7 = 0;
    lVar8 = 0;
    do {
      lVar9 = (ulong)puVar3[uVar6 + sVar7] + (lVar8 - (ulong)puVar2[sVar7]);
      puVar3[uVar6 + sVar7] = (uint)lVar9;
      lVar8 = lVar9 >> 0x3f;
      sVar7 = sVar7 + 1;
    } while (sVar1 != sVar7);
    if (lVar9 < 0) {
      if ((int)(uVar6 + sVar7) < 0) goto LAB_0018ad14;
      puVar2 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
      uVar6 = uVar6 + sVar7 & 0xffffffff;
      uVar5 = puVar2[uVar6];
      lVar8 = -1;
      do {
        lVar8 = lVar8 + (ulong)uVar5;
        uVar5 = (uint)lVar8;
      } while (lVar8 < 0);
      puVar2[uVar6] = uVar5;
    }
  }
  remove_leading_zeros(this);
  return;
}

Assistant:

void subtract_aligned(const bigint& other) {
    FMT_ASSERT(other.exp_ >= exp_, "unaligned bigints");
    FMT_ASSERT(compare(*this, other) >= 0, "");
    bigit borrow = 0;
    int i = other.exp_ - exp_;
    for (size_t j = 0, n = other.bigits_.size(); j != n; ++i, ++j) {
      subtract_bigits(i, other.bigits_[j], borrow);
    }
    while (borrow > 0) subtract_bigits(i, 0, borrow);
    remove_leading_zeros();
  }